

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_curv_edge_tangents(Omega_h *this,Mesh *mesh,LOs *curv_edge2edge)

{
  LOs *pLVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Reals RVar4;
  Read<int> local_50 [2];
  Read<int> local_30;
  LOs *local_20;
  LOs *curv_edge2edge_local;
  Mesh *mesh_local;
  
  local_20 = curv_edge2edge;
  curv_edge2edge_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  IVar2 = Mesh::dim(mesh);
  pLVar1 = curv_edge2edge_local;
  if (IVar2 == 3) {
    Read<int>::Read(&local_30,curv_edge2edge);
    get_curv_edge_tangents_dim<3>(this,(Mesh *)pLVar1,&local_30);
    Read<int>::~Read(&local_30);
    pvVar3 = extraout_RDX;
  }
  else {
    IVar2 = Mesh::dim((Mesh *)curv_edge2edge_local);
    pLVar1 = curv_edge2edge_local;
    if (IVar2 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x6f);
    }
    Read<int>::Read(local_50,curv_edge2edge);
    get_curv_edge_tangents_dim<2>(this,(Mesh *)pLVar1,local_50);
    Read<int>::~Read(local_50);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_curv_edge_tangents(Mesh* mesh, LOs curv_edge2edge) {
  if (mesh->dim() == 3)
    return get_curv_edge_tangents_dim<3>(mesh, curv_edge2edge);
  if (mesh->dim() == 2)
    return get_curv_edge_tangents_dim<2>(mesh, curv_edge2edge);
  OMEGA_H_NORETURN(Reals());
}